

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liolib.c
# Opt level: O2

void opencheck(lua_State *L,char *fname,char *mode)

{
  LStream *pLVar1;
  FILE *pFVar2;
  int *piVar3;
  char *pcVar4;
  
  pLVar1 = newfile(L);
  pFVar2 = fopen64(fname,mode);
  pLVar1->f = (FILE *)pFVar2;
  if (pFVar2 != (FILE *)0x0) {
    return;
  }
  piVar3 = __errno_location();
  pcVar4 = strerror(*piVar3);
  luaL_error(L,"cannot open file \'%s\' (%s)",fname,pcVar4);
  return;
}

Assistant:

static void opencheck (lua_State *L, const char *fname, const char *mode) {
  LStream *p = newfile(L);
  p->f = fopen(fname, mode);
  if (p->f == NULL)
    luaL_error(L, "cannot open file '%s' (%s)", fname, strerror(errno));
}